

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O3

double bench_sched_perf(size_t ntasks)

{
  double dVar1;
  pointer pdVar2;
  ostream *poVar3;
  pointer pdVar4;
  char local_3a [2];
  double local_38;
  double local_30;
  
  local_38 = 0.0;
  if (!OnlyParallelRun) {
    if (!ClearCaches) {
      bench_parallel_time(ntasks,1);
    }
    local_38 = bench_serial_time(ntasks,NReps);
    pdVar2 = TSeq.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (Verbosity != 0) {
      if (1 < Verbosity) {
        if (TSeq.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start !=
            TSeq.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          pdVar4 = TSeq.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            dVar1 = *pdVar4;
            *(undefined8 *)
             (&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 8;
            poVar3 = std::ostream::_M_insert<double>(dVar1);
            local_3a[0] = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3a,1);
            pdVar4 = pdVar4 + 1;
          } while (pdVar4 != pdVar2);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  serial time=",0xe)
      ;
      poVar3 = std::ostream::_M_insert<double>(local_38);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  local_30 = bench_parallel_time(ntasks,NReps);
  pdVar2 = TPar.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (Verbosity != 0) {
    if (1 < Verbosity) {
      if (TPar.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          TPar.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        pdVar4 = TPar.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          dVar1 = *pdVar4;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 8;
          poVar3 = std::ostream::_M_insert<double>(dVar1);
          local_3a[1] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3a + 1,1);
          pdVar4 = pdVar4 + 1;
        } while (pdVar4 != pdVar2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parallel time=",0xe);
    poVar3 = std::ostream::_M_insert<double>(local_30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if (OnlyParallelRun == false) {
    if ((UseSameTile == false) && (ParallelBaseline == false)) {
      local_38 = local_38 / (double)Nthreads;
    }
    local_30 = local_30 / local_38;
  }
  else {
    local_30 = 1.0;
  }
  return local_30;
}

Assistant:

double bench_sched_perf(const size_t ntasks)
{ double serial_time = 0.;
  
  if (!OnlyParallelRun) {
    
    // heat the caches if they are not going to be cleaned.
    //It is not done in profiling runs because of the runtime impact
    if (!ClearCaches) {
      bench_parallel_time(ntasks, 1);
    }
    
    serial_time = bench_serial_time(ntasks, NReps);
    if(Verbosity) {
      if (Verbosity > 1) {
        for (double t : TSeq) {
          std::cout << std::setw(8) << t << ' ';
        }
      }
      std::cout << "  serial time=" << serial_time << std::endl;
    }
  }

  const double parallel_time = bench_parallel_time(ntasks, NReps);
  if(Verbosity) {
    if (Verbosity > 1) {
      for (double t : TPar) {
        std::cout << std::setw(8) << t << ' ';
      }
    }
    std::cout << "parallel time=" << parallel_time << std::endl;
  }
  
  if (OnlyParallelRun) {
    return 1.0;
  } else {
    // if UseSameTile the runtime cannot scale linearly, and if ParallelBaseline we just want a one-to-one comparison
    //So only in sequential baselines with different tiles do we compare with the theoretical Time/Nthreads scaling
    const double baseline_time = (UseSameTile || ParallelBaseline) ? serial_time : (serial_time / Nthreads);
    return parallel_time / baseline_time;
  }
}